

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  Descriptor *pDVar2;
  int __c;
  int __c_00;
  char *pcVar3;
  value_type_conflict1 local_20;
  value_type_conflict1 local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  Descriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  pDVar2 = containing_type(this);
  if (pDVar2 == (Descriptor *)0x0) {
    pcVar3 = "\x04";
    std::vector<int,_std::allocator<int>_>::push_back
              (local_18,&FileDescriptorProto::kMessageTypeFieldNumber);
    pvVar1 = local_18;
    pcVar3 = index(this,pcVar3,__c_00);
    local_20 = (value_type_conflict1)pcVar3;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&local_20);
  }
  else {
    pDVar2 = containing_type(this);
    GetLocationPath(pDVar2,local_18);
    pcVar3 = "\x03";
    std::vector<int,_std::allocator<int>_>::push_back
              (local_18,&DescriptorProto::kNestedTypeFieldNumber);
    pvVar1 = local_18;
    pcVar3 = index(this,pcVar3,__c);
    local_1c = (value_type_conflict1)pcVar3;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&local_1c);
  }
  return;
}

Assistant:

void Descriptor::GetLocationPath(vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}